

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O0

int __thiscall
ImPlotColormapData::Append(ImPlotColormapData *this,char *name,ImU32 *keys,int count,bool qual)

{
  ImU32 *str;
  ImPlotColormap IVar1;
  int iVar2;
  ImGuiID key;
  size_t sVar3;
  int idx;
  ImGuiID id;
  int local_34;
  int i;
  int local_2c;
  bool qual_local;
  ImU32 *pIStack_28;
  int count_local;
  ImU32 *keys_local;
  char *name_local;
  ImPlotColormapData *this_local;
  
  i._3_1_ = qual;
  local_2c = count;
  pIStack_28 = keys;
  keys_local = (ImU32 *)name;
  name_local = (char *)this;
  IVar1 = GetIndex(this,name);
  if (IVar1 == -1) {
    local_34 = ImVector<unsigned_int>::size(&this->Keys);
    ImVector<int>::push_back(&this->KeyOffsets,&local_34);
    ImVector<int>::push_back(&this->KeyCounts,&local_2c);
    iVar2 = ImVector<unsigned_int>::size(&this->Keys);
    ImVector<unsigned_int>::reserve(&this->Keys,iVar2 + local_2c);
    for (id = 0; (int)id < local_2c; id = id + 1) {
      ImVector<unsigned_int>::push_back(&this->Keys,pIStack_28 + (int)id);
    }
    idx = ImGuiTextBuffer::size(&this->Text);
    ImVector<int>::push_back(&this->TextOffsets,&idx);
    str = keys_local;
    sVar3 = strlen((char *)keys_local);
    ImGuiTextBuffer::append(&this->Text,(char *)str,(char *)((long)str + sVar3 + 1));
    ImVector<bool>::push_back(&this->Quals,(bool *)((long)&i + 3));
    key = ImHashStr((char *)keys_local,0,0);
    iVar2 = this->Count;
    this->Count = iVar2 + 1;
    ImGuiStorage::SetInt(&this->Map,key,iVar2);
    _AppendTable(this,iVar2);
    this_local._4_4_ = iVar2;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int Append(const char* name, const ImU32* keys, int count, bool qual) {
        if (GetIndex(name) != -1)
            return -1;
        KeyOffsets.push_back(Keys.size());
        KeyCounts.push_back(count);
        Keys.reserve(Keys.size()+count);
        for (int i = 0; i < count; ++i)
            Keys.push_back(keys[i]);
        TextOffsets.push_back(Text.size());
        Text.append(name, name + strlen(name) + 1);
        Quals.push_back(qual);
        ImGuiID id = ImHashStr(name);
        int idx = Count++;
        Map.SetInt(id,idx);
        _AppendTable(idx);
        return idx;
    }